

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ComputeShaderBase::ValidateWindow4Quads
          (ComputeShaderBase *this,vec3 *lb,vec3 *rb,vec3 *rt,vec3 *lt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  GLsizei height_00;
  GLsizei width_00;
  bool bVar7;
  reference pvVar8;
  float *pfVar9;
  Vector<float,_3> local_c8;
  int local_bc;
  uint local_b8;
  int idx_5;
  int x_5;
  int y_5;
  int local_a4;
  uint local_a0;
  int idx_4;
  int x_4;
  int y_4;
  int idx_3;
  int x_3;
  int y_3;
  int idx_2;
  int x_2;
  int y_2;
  int idx_1;
  int x_1;
  int y_1;
  int idx;
  int x;
  int y;
  bool status;
  allocator<tcu::Vector<float,_3>_> local_51;
  undefined1 local_50 [8];
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fb;
  int height;
  int width;
  vec3 *lt_local;
  vec3 *rt_local;
  vec3 *rb_local;
  vec3 *lb_local;
  ComputeShaderBase *this_local;
  
  fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 100;
  fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 100;
  std::allocator<tcu::Vector<float,_3>_>::allocator(&local_51);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_50,
             10000,&local_51);
  std::allocator<tcu::Vector<float,_3>_>::~allocator(&local_51);
  width_00 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  height_00 = (GLsizei)fb.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator[]
                     ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                      local_50,0);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,width_00,height_00,
             0x1907,0x1406,pvVar8);
  x._3_1_ = 1;
  for (idx = 10;
      idx < (GLsizei)fb.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage / 2 + -10; idx = idx + 1) {
    for (y_1 = 10;
        y_1 < fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ / 2 + -10; y_1 = y_1 + 1) {
      x_1 = idx * fb.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + y_1;
      pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_50,(long)x_1);
      bVar7 = ColorEqual(this,pvVar8,lb,&this->g_color_eps);
      iVar5 = idx;
      iVar4 = y_1;
      if (!bVar7) {
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)x_1);
        pfVar9 = tcu::Vector<float,_3>::x(pvVar8);
        fVar1 = *pfVar9;
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)x_1);
        pfVar9 = tcu::Vector<float,_3>::y(pvVar8);
        fVar2 = *pfVar9;
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)x_1);
        pfVar9 = tcu::Vector<float,_3>::z(pvVar8);
        anon_unknown_0::Output
                  ("First bad color (%d, %d): %f %f %f\n",(double)fVar1,(double)fVar2,
                   (double)*pfVar9,(ulong)(uint)iVar4,(ulong)(uint)iVar5);
        x._3_1_ = 0;
      }
    }
  }
  for (idx_1 = 10;
      idx_1 < (GLsizei)fb.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage / 2 + -10;
      idx_1 = idx_1 + 1) {
    for (y_2 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ / 2 + 10;
        y_2 < fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -10; y_2 = y_2 + 1) {
      x_2 = idx_1 * fb.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + y_2;
      pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_50,(long)x_2);
      bVar7 = ColorEqual(this,pvVar8,rb,&this->g_color_eps);
      iVar5 = idx_1;
      iVar4 = y_2;
      if (!bVar7) {
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)x_2);
        pfVar9 = tcu::Vector<float,_3>::x(pvVar8);
        fVar1 = *pfVar9;
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)x_2);
        pfVar9 = tcu::Vector<float,_3>::y(pvVar8);
        fVar2 = *pfVar9;
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)x_2);
        pfVar9 = tcu::Vector<float,_3>::z(pvVar8);
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,(double)fVar2,(double)*pfVar9,
                   (ulong)(uint)iVar4,(ulong)(uint)iVar5);
        x._3_1_ = 0;
      }
    }
  }
  for (idx_2 = (GLsizei)fb.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage / 2 + 10;
      idx_2 < (GLsizei)fb.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + -10; idx_2 = idx_2 + 1)
  {
    for (y_3 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ / 2 + 10;
        y_3 < fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -10; y_3 = y_3 + 1) {
      x_3 = idx_2 * fb.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + y_3;
      pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_50,(long)x_3);
      bVar7 = ColorEqual(this,pvVar8,rt,&this->g_color_eps);
      iVar5 = idx_2;
      iVar4 = y_3;
      if (!bVar7) {
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)x_3);
        pfVar9 = tcu::Vector<float,_3>::x(pvVar8);
        fVar1 = *pfVar9;
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)x_3);
        pfVar9 = tcu::Vector<float,_3>::y(pvVar8);
        fVar2 = *pfVar9;
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)x_3);
        pfVar9 = tcu::Vector<float,_3>::z(pvVar8);
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,(double)fVar2,(double)*pfVar9,
                   (ulong)(uint)iVar4,(ulong)(uint)iVar5);
        x._3_1_ = 0;
      }
    }
  }
  for (idx_3 = (GLsizei)fb.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage / 2 + 10;
      idx_3 < (GLsizei)fb.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + -10; idx_3 = idx_3 + 1)
  {
    for (y_4 = 10;
        y_4 < fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ / 2 + -10; y_4 = y_4 + 1) {
      x_4 = idx_3 * fb.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + y_4;
      pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_50,(long)x_4);
      bVar7 = ColorEqual(this,pvVar8,lt,&this->g_color_eps);
      iVar5 = idx_3;
      iVar4 = y_4;
      if (!bVar7) {
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)x_4);
        pfVar9 = tcu::Vector<float,_3>::x(pvVar8);
        fVar1 = *pfVar9;
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)x_4);
        pfVar9 = tcu::Vector<float,_3>::y(pvVar8);
        fVar2 = *pfVar9;
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)x_4);
        pfVar9 = tcu::Vector<float,_3>::z(pvVar8);
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,(double)fVar2,(double)*pfVar9,
                   (ulong)(uint)iVar4,(ulong)(uint)iVar5);
        x._3_1_ = 0;
      }
    }
  }
  for (idx_4 = (GLsizei)fb.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage / 2 + -2;
      idx_4 < (GLsizei)fb.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage / 2 + 2; idx_4 = idx_4 + 1
      ) {
    for (local_a0 = 0;
        (int)local_a0 <
        fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_a0 = local_a0 + 1) {
      local_a4 = idx_4 * fb.
                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + local_a0;
      pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_50,(long)local_a4);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&x_5,0.0);
      bVar7 = ColorEqual(this,pvVar8,(vec3 *)&x_5,&this->g_color_eps);
      iVar4 = idx_4;
      uVar3 = local_a0;
      if (((bVar7 ^ 0xffU) & 1) != 0) {
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)local_a4);
        pfVar9 = tcu::Vector<float,_3>::x(pvVar8);
        fVar1 = *pfVar9;
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)local_a4);
        pfVar9 = tcu::Vector<float,_3>::y(pvVar8);
        fVar2 = *pfVar9;
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)local_a4);
        pfVar9 = tcu::Vector<float,_3>::z(pvVar8);
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,(double)fVar2,(double)*pfVar9,
                   (ulong)uVar3,(ulong)(uint)iVar4);
        x._3_1_ = 0;
      }
    }
  }
  for (idx_5 = 0; bVar6 = x._3_1_,
      idx_5 < (GLsizei)fb.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage; idx_5 = idx_5 + 1) {
    for (local_b8 = fb.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ / 2 - 2;
        (int)local_b8 <
        fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ / 2 + 2; local_b8 = local_b8 + 1) {
      local_bc = idx_5 * fb.
                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + local_b8;
      pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_50,(long)local_bc);
      tcu::Vector<float,_3>::Vector(&local_c8,0.0);
      bVar7 = ColorEqual(this,pvVar8,&local_c8,&this->g_color_eps);
      iVar4 = idx_5;
      uVar3 = local_b8;
      if (((bVar7 ^ 0xffU) & 1) != 0) {
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)local_bc);
        pfVar9 = tcu::Vector<float,_3>::x(pvVar8);
        fVar1 = *pfVar9;
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)local_bc);
        pfVar9 = tcu::Vector<float,_3>::y(pvVar8);
        fVar2 = *pfVar9;
        pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_50,(long)local_bc);
        pfVar9 = tcu::Vector<float,_3>::z(pvVar8);
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,(double)fVar2,(double)*pfVar9,
                   (ulong)uVar3,(ulong)(uint)iVar4);
        x._3_1_ = 0;
      }
    }
  }
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_50);
  return (bool)(bVar6 & 1);
}

Assistant:

bool ValidateWindow4Quads(const vec3& lb, const vec3& rb, const vec3& rt, const vec3& lt)
	{
		int				  width  = 100;
		int				  height = 100;
		std::vector<vec3> fb(width * height);
		glReadPixels(0, 0, width, height, GL_RGB, GL_FLOAT, &fb[0]);

		bool status = true;

		// left-bottom quad
		for (int y = 10; y < height / 2 - 10; ++y)
		{
			for (int x = 10; x < width / 2 - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], lb, g_color_eps))
				{
					Output("First bad color (%d, %d): %f %f %f\n", x, y, fb[idx].x(), fb[idx].y(), fb[idx].z());
					status = false;
				}
			}
		}
		// right-bottom quad
		for (int y = 10; y < height / 2 - 10; ++y)
		{
			for (int x = width / 2 + 10; x < width - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], rb, g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx].x(), fb[idx].y(), fb[idx].z());
					status = false;
				}
			}
		}
		// right-top quad
		for (int y = height / 2 + 10; y < height - 10; ++y)
		{
			for (int x = width / 2 + 10; x < width - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], rt, g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx].x(), fb[idx].y(), fb[idx].z());
					status = false;
				}
			}
		}
		// left-top quad
		for (int y = height / 2 + 10; y < height - 10; ++y)
		{
			for (int x = 10; x < width / 2 - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], lt, g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx].x(), fb[idx].y(), fb[idx].z());
					status = false;
				}
			}
		}
		// middle horizontal line should be black
		for (int y = height / 2 - 2; y < height / 2 + 2; ++y)
		{
			for (int x = 0; x < width; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], vec3(0), g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx].x(), fb[idx].y(), fb[idx].z());
					status = false;
				}
			}
		}
		// middle vertical line should be black
		for (int y = 0; y < height; ++y)
		{
			for (int x = width / 2 - 2; x < width / 2 + 2; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], vec3(0), g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx].x(), fb[idx].y(), fb[idx].z());
					status = false;
				}
			}
		}

		return status;
	}